

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

void j2k_read_float32_to_float(void *p_src_data,void *p_dest_data,OPJ_UINT32 p_nb_elem)

{
  uint in_EDX;
  OPJ_FLOAT32 *in_RSI;
  OPJ_BYTE *in_RDI;
  OPJ_FLOAT32 l_temp;
  OPJ_UINT32 i;
  OPJ_FLOAT32 *l_dest_data;
  OPJ_BYTE *l_src_data;
  OPJ_FLOAT32 local_30;
  uint local_2c;
  OPJ_FLOAT32 *local_28;
  OPJ_BYTE *local_20;
  uint local_14;
  
  local_28 = in_RSI;
  local_20 = in_RDI;
  local_14 = in_EDX;
  for (local_2c = 0; local_2c < local_14; local_2c = local_2c + 1) {
    opj_read_float_LE(local_20,&local_30);
    local_20 = local_20 + 4;
    *local_28 = local_30;
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void  j2k_read_float32_to_float (const void * p_src_data, void * p_dest_data, OPJ_UINT32 p_nb_elem)
{
	OPJ_BYTE * l_src_data = (OPJ_BYTE *) p_src_data;
	OPJ_FLOAT32 * l_dest_data = (OPJ_FLOAT32 *) p_dest_data;
	OPJ_UINT32 i;
	OPJ_FLOAT32 l_temp;

	for (i=0;i<p_nb_elem;++i) {
		opj_read_float(l_src_data,&l_temp);

		l_src_data+=sizeof(OPJ_FLOAT32);

		*(l_dest_data++) = l_temp;
	}
}